

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_short<std::__cxx11::string,boost::optional<int>,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *param_3,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_4,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  char cVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var8;
  pointer *ppbVar9;
  undefined8 unaff_RBP;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  shared_ptr<int> v;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  long local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  long *local_c0 [2];
  long local_b0 [2];
  char **local_a0;
  long local_98;
  char *local_90 [2];
  _Any_data local_80;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
  *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  pointer *local_50;
  pointer local_48;
  pointer local_40;
  pointer pbStack_38;
  
  if (it->_M_current + 1 == last._M_current) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00169b98;
    *(undefined1 *)&p_Var4[1]._vptr__Sp_counted_base = 0;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var4 + 1);
    p_Var3 = (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = p_Var4;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  cVar1 = *it->_M_current;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_c0);
  it->_M_current = last._M_current + -1;
  if ((flg->read).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar7 = std::__throw_bad_function_call();
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_a0 != (char **)CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar1)) {
      operator_delete(local_a0,(ulong)(local_90[0] + 1));
    }
    if (local_e0 != it) {
      operator_delete(local_e0,(ulong)(local_d0._M_current + 1));
    }
    if (local_70 != flg) {
      operator_delete(local_70,(ulong)(local_60._0_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    _Unwind_Resume(uVar7);
  }
  (*(flg->read)._M_invoker)
            (&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
  if ((uint *)local_80._M_unused._0_8_ != (uint *)0x0) {
    uVar2 = *local_80._M_unused._M_object;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00169b98;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)(((ulong)uVar2 << 0x20) + 1);
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var4 + 1);
    p_Var3 = (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = p_Var4;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    goto LAB_00152f95;
  }
  local_70 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
              *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"invalid argument: -","");
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(plVar5 + 2);
  if ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)*plVar5 == p_Var8) {
    local_d0._M_current = p_Var8->_M_current;
    uStack_c8 = (undefined4)plVar5[3];
    uStack_c4 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_e0 = &local_d0;
  }
  else {
    local_d0._M_current = p_Var8->_M_current;
    local_e0 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)*plVar5;
  }
  local_d8 = plVar5[1];
  *plVar5 = (long)p_Var8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0," ","");
  _Var10._M_current = (char *)0xf;
  if (local_e0 != &local_d0) {
    _Var10._M_current = local_d0._M_current;
  }
  if (_Var10._M_current < (char *)(local_98 + local_d8)) {
    pcVar11 = (char *)0xf;
    if (local_a0 != local_90) {
      pcVar11 = local_90[0];
    }
    if (pcVar11 < (char *)(local_98 + local_d8)) goto LAB_00152e37;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_00152e37:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
  }
  local_100 = &local_f0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_f0 = *plVar5;
    uStack_e8 = puVar6[3];
  }
  else {
    local_f0 = *plVar5;
    local_100 = (long *)*puVar6;
  }
  local_f8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_c0[0]);
  ppbVar9 = (pointer *)(plVar5 + 2);
  if ((pointer *)*plVar5 == ppbVar9) {
    local_40 = *ppbVar9;
    pbStack_38 = (pointer)plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *ppbVar9;
    local_50 = (pointer *)*plVar5;
  }
  local_48 = (pointer)plVar5[1];
  *plVar5 = (long)ppbVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,(ulong)((long)&(local_40->_M_dataplus)._M_p + 1));
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,(ulong)(local_90[0] + 1));
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,(ulong)(local_d0._M_current + 1));
  }
  if (local_70 !=
      (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
       *)local_60) {
    operator_delete(local_70,(ulong)(local_60._0_8_ + 1));
  }
LAB_00152f95:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        if (std::next(it) == last) {
            value = std::make_shared<Value>();
        } else {
            auto const s = String(std::next(it), last);
            it = std::prev(last);
            auto const v = flg.read(s);
            if (!v) {
                err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }